

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_textedit_init(nk_text_edit *state,nk_allocator *alloc,nk_size size)

{
  nk_size size_local;
  nk_allocator *alloc_local;
  nk_text_edit *state_local;
  
  if (state == (nk_text_edit *)0x0) {
    __assert_fail("state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x57b8,
                  "void nk_textedit_init(struct nk_text_edit *, struct nk_allocator *, nk_size)");
  }
  if (alloc == (nk_allocator *)0x0) {
    __assert_fail("alloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x57b9,
                  "void nk_textedit_init(struct nk_text_edit *, struct nk_allocator *, nk_size)");
  }
  if ((state != (nk_text_edit *)0x0) && (alloc != (nk_allocator *)0x0)) {
    nk_memset(state,0,0x1508);
    nk_textedit_clear_state(state,NK_TEXT_EDIT_SINGLE_LINE,(nk_plugin_filter)0x0);
    nk_str_init(&state->string,alloc,size);
  }
  return;
}

Assistant:

NK_API void
nk_textedit_init(struct nk_text_edit *state, struct nk_allocator *alloc, nk_size size)
{
    NK_ASSERT(state);
    NK_ASSERT(alloc);
    if (!state || !alloc) return;
    NK_MEMSET(state, 0, sizeof(struct nk_text_edit));
    nk_textedit_clear_state(state, NK_TEXT_EDIT_SINGLE_LINE, 0);
    nk_str_init(&state->string, alloc, size);
}